

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O3

Tag * __thiscall
Mustache::Renderer::findEndTag
          (Tag *__return_storage_ptr__,Renderer *this,QString *content,Tag *startTag,int endPos)

{
  bool bVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  int iVar5;
  int pos;
  QStringView QVar6;
  QByteArrayView QVar7;
  QStringView QVar8;
  Tag local_a8;
  Tag *local_78;
  int *local_70;
  QString local_68;
  QString *local_50;
  QArrayData *local_48;
  char16_t *pcStack_40;
  qsizetype local_38;
  
  pos = startTag->end;
  local_50 = &__return_storage_ptr__->key;
  local_70 = &__return_storage_ptr__->start;
  iVar5 = 1;
  local_78 = startTag;
  do {
    findTag(&local_a8,this,content,pos,endPos);
    qVar4 = local_a8.key.d.size;
    pcVar3 = local_a8.key.d.ptr;
    pDVar2 = local_a8.key.d.d;
    if (local_a8.type == Null) {
      __return_storage_ptr__->type = Null;
      bVar1 = false;
      local_a8.key.d.d = (Data *)0x0;
      (__return_storage_ptr__->key).d.d = pDVar2;
      (__return_storage_ptr__->key).d.ptr = local_a8.key.d.ptr;
      local_a8.key.d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->key).d.size = local_a8.key.d.size;
      local_a8.key.d.size = 0;
      *(ulong *)local_70 = CONCAT44(local_a8.end,local_a8.start);
      *(undefined8 *)(local_70 + 2) = local_a8._40_8_;
    }
    else {
      if ((local_a8.type & ~Value) == SectionStart) {
        iVar5 = iVar5 + 1;
      }
      else if (local_a8.type == SectionEnd) {
        iVar5 = iVar5 + -1;
        if (iVar5 == 0) {
          if (local_a8.key.d.size == (local_78->key).d.size) {
            QVar6.m_data = local_a8.key.d.ptr;
            QVar6.m_size = local_a8.key.d.size;
            QVar8.m_data = (local_78->key).d.ptr;
            QVar8.m_size = local_a8.key.d.size;
            iVar5 = QtPrivate::compareStrings(QVar6,QVar8,CaseSensitive);
            if (iVar5 != 0) goto LAB_00117a11;
            __return_storage_ptr__->type = SectionEnd;
            (__return_storage_ptr__->key).d.d = local_a8.key.d.d;
            local_a8.key.d.d = (Data *)0x0;
            (__return_storage_ptr__->key).d.ptr = pcVar3;
            local_a8.key.d.ptr = (char16_t *)0x0;
            (__return_storage_ptr__->key).d.size = qVar4;
            local_a8.key.d.size = 0;
            *(ulong *)local_70 = CONCAT44(local_a8.end,local_a8.start);
            *(undefined8 *)(local_70 + 2) = local_a8._40_8_;
          }
          else {
LAB_00117a11:
            QVar7.m_data = (storage_type *)0x1a;
            QVar7.m_size = (qsizetype)&local_48;
            QString::fromUtf8(QVar7);
            local_68.d.d = (Data *)local_48;
            local_68.d.ptr = pcStack_40;
            local_68.d.size = local_38;
            setError(this,&local_68,local_a8.start);
            if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
              }
            }
            __return_storage_ptr__->type = Null;
            (local_50->d).size = 0;
            *(undefined8 *)(local_50 + 1) = 0;
            (local_50->d).d = (Data *)0x0;
            (local_50->d).ptr = (char16_t *)0x0;
            *(undefined8 *)((long)(local_50 + 1) + 8) = 0;
          }
          iVar5 = 0;
          bVar1 = false;
          goto LAB_001179a7;
        }
      }
      bVar1 = true;
      pos = local_a8.end;
    }
LAB_001179a7:
    if (&(local_a8.key.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.key.d.d)->super_QArrayData,2,8);
      }
    }
    if (!bVar1) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Tag Renderer::findEndTag(const QString& content, const Tag& startTag, int endPos)
{
	int tagDepth = 1;
	int pos = startTag.end;

	while (true) {
		Tag nextTag = findTag(content, pos, endPos);
		if (nextTag.type == Tag::Null) {
			return nextTag;
		} else if (nextTag.type == Tag::SectionStart || nextTag.type == Tag::InvertedSectionStart) {
			++tagDepth;
		} else if (nextTag.type == Tag::SectionEnd) {
			--tagDepth;
			if (tagDepth == 0) {
				if (nextTag.key != startTag.key) {
					setError("Tag start/end key mismatch", nextTag.start);
					return Tag();
				}
				return nextTag;
			}
		}
		pos = nextTag.end;
	}

	return Tag();
}